

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O2

bool __thiscall mnf::CartesianProduct::isSameTopology(CartesianProduct *this,Manifold *other)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t i;
  ulong uVar6;
  bool bVar7;
  
  bVar7 = false;
  lVar5 = __dynamic_cast(other,&Manifold::typeinfo,&typeinfo,0);
  if (lVar5 != 0) {
    iVar3 = (*(this->super_Manifold)._vptr_Manifold[7])(this);
    iVar4 = (*other->_vptr_Manifold[7])(other);
    if (CONCAT44(extraout_var,iVar3) == CONCAT44(extraout_var_00,iVar4)) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        iVar3 = (*(this->super_Manifold)._vptr_Manifold[7])(this);
        bVar7 = CONCAT44(extraout_var_01,iVar3) <= uVar6;
        if (bVar7) {
          return bVar7;
        }
        plVar1 = *(long **)((long)&(((this->subManifolds_).
                                     super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar5);
        iVar3 = (*other->_vptr_Manifold[8])(other,uVar6);
        cVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,iVar3);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (cVar2 != '\0');
    }
    else {
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool CartesianProduct::isSameTopology(const Manifold& other) const
{
  if (dynamic_cast<const CartesianProduct*>(&other) &&
      numberOfSubManifolds() == other.numberOfSubManifolds())
  {
    for (size_t i = 0; i < numberOfSubManifolds(); ++i)
    {
      if (!subManifolds_[i]->isSameTopology(other(i))) return false;
    }
    return true;
  }
  else
    return false;
}